

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O0

void test_ADynArray_construct_destruct_withAllocator_valid_fn(int _i)

{
  void *dynArray;
  uintmax_t _ck_y_2;
  uintmax_t _ck_x_4;
  void *_ck_x_3;
  void *_ck_x_2;
  uintmax_t _ck_y_1;
  uintmax_t _ck_x_1;
  uintmax_t _ck_y;
  uintmax_t _ck_x;
  private_ACUtilsTest_ADynArray_CharArray *array;
  int _i_local;
  
  private_ACUtilsTest_ADynArray_reallocFail = false;
  private_ACUtilsTest_ADynArray_freeCount = 0;
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  dynArray = private_ACUtils_ADynArray_constructWithAllocator
                       (1,private_ACUtilsTest_ADynArray_realloc,private_ACUtilsTest_ADynArray_free);
  if (*(long *)((long)dynArray + 0x18) != 0) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x41,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju","array->size == 0",
                      "array->size",*(long *)((long)dynArray + 0x18),"0",0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x41);
  if (*(long *)((long)dynArray + 0x20) != 8) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x42,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                      "array->capacity == private_ACUtilsTest_ADynArray_capacityMin",
                      "array->capacity",*(long *)((long)dynArray + 0x20),
                      "private_ACUtilsTest_ADynArray_capacityMin",8,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x42);
  if (*(long *)((long)dynArray + 0x28) == 0) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x43,"Assertion \'_ck_x != NULL\' failed",
                      "Assertion \'%s\' failed: %s == %#x","(void*) array->buffer != NULL",
                      "(void*) array->buffer",0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x43);
  if (*(long *)((long)dynArray + 0x10) != 0) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x44);
    private_ACUtils_ADynArray_destruct(dynArray);
    if (private_ACUtilsTest_ADynArray_reallocCount == private_ACUtilsTest_ADynArray_freeCount) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x46);
      return;
    }
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x46,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                      "private_ACUtilsTest_ADynArray_reallocCount == private_ACUtilsTest_ADynArray_freeCount"
                      ,"private_ACUtilsTest_ADynArray_reallocCount",
                      private_ACUtilsTest_ADynArray_reallocCount,
                      "private_ACUtilsTest_ADynArray_freeCount",
                      private_ACUtilsTest_ADynArray_freeCount,0);
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x44,"Assertion \'_ck_x != NULL\' failed","Assertion \'%s\' failed: %s == %#x",
                    "(void*) array->growStrategy != NULL","(void*) array->growStrategy",0,0);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_construct_destruct_withAllocator_valid)
{
    struct private_ACUtilsTest_ADynArray_CharArray *array;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    private_ACUtilsTest_ADynArray_reallocCount = private_ACUtilsTest_ADynArray_freeCount = 0;
    array = ADynArray_constructWithAllocator(struct private_ACUtilsTest_ADynArray_CharArray, private_ACUtilsTest_ADynArray_realloc, private_ACUtilsTest_ADynArray_free);
    ACUTILSTEST_ASSERT_UINT_EQ(array->size, 0);
    ACUTILSTEST_ASSERT_UINT_EQ(array->capacity, private_ACUtilsTest_ADynArray_capacityMin);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array->buffer);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array->growStrategy);
    ADynArray_destruct(array);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, private_ACUtilsTest_ADynArray_freeCount);
}